

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

Allocation __thiscall
density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
external_allocate<0ul>
          (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
           *this,size_t i_size,size_t i_alignment)

{
  void *pvVar1;
  Allocation AVar3;
  undefined8 *puVar2;
  
  LOCK();
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
  UNLOCK();
  LOCK();
  *(size_t *)(this + 0x20) = *(long *)(this + 0x20) + i_size;
  UNLOCK();
  LOCK();
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  UNLOCK();
  pvVar1 = basic_default_allocator<65536UL>::allocate
                     ((basic_default_allocator<65536UL> *)this,i_size,i_alignment,0);
  AVar3 = inplace_allocate<0ul,true>(this,0x18,8);
  puVar2 = (undefined8 *)AVar3.m_user_storage;
  *puVar2 = pvVar1;
  puVar2[1] = i_size;
  puVar2[2] = i_alignment;
  if (((AVar3.m_control_block)->m_next & 4) != 0) {
    density_tests::detail::assert_failed<>
              ("(inplace_put.m_control_block->m_next & detail::Queue_External) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb09);
  }
  *(byte *)&(AVar3.m_control_block)->m_next = (byte)(AVar3.m_control_block)->m_next | 4;
  AVar3.m_user_storage = pvVar1;
  return AVar3;
}

Assistant:

Allocation external_allocate(size_t i_size, size_t i_alignment)
        {
            auto const external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
            try
            {
                /* external blocks always allocate space for the type, because it would be complicated
                    for the consumers to handle both cases*/
                auto const inplace_put = inplace_allocate<CONTROL_BITS, true>(
                  sizeof(ExternalBlock), alignof(ExternalBlock));

                new (inplace_put.m_user_storage) ExternalBlock{external_block, i_size, i_alignment};

                DENSITY_ASSERT((inplace_put.m_control_block->m_next & detail::Queue_External) == 0);
                inplace_put.m_control_block->m_next |= detail::Queue_External;
                return Allocation{inplace_put.m_control_block, external_block};
            }
            catch (...)
            {
                /* if inplace_allocate fails, that means that we were able to allocate the external block,
                    but we were not able to put the struct ExternalBlock in the page (because a new page was
                    necessary, but we could not allocate it). */
                ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                throw;
            }
        }